

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O3

size_t __thiscall
duckdb::FSSTCompressionState::GetRequiredSize(FSSTCompressionState *this,size_t string_len)

{
  uint uVar1;
  unsigned_long uVar2;
  unsigned_long value;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  
  if (this->max_compressed_string_length < string_len) {
    lVar4 = 0x3f;
    if (string_len != 0) {
      for (; string_len >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    bVar3 = 0x40;
    if (string_len >> 0x38 == 0) {
      bVar3 = 0x40 - ((byte)lVar4 ^ 0x3f);
    }
  }
  else {
    bVar3 = this->current_width;
  }
  uVar1 = (this->current_dictionary).size;
  lVar4 = (long)(this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  uVar5 = lVar4 + 1;
  if ((uVar5 & 0x1f) != 0) {
    uVar2 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar5 & 0x1f);
    uVar5 = (lVar4 - uVar2) + 0x21;
  }
  return (bVar3 * uVar5 >> 3) + string_len + uVar1 + this->fsst_serialized_symbol_table_size + 0x10;
}

Assistant:

size_t GetRequiredSize(size_t string_len) {
		bitpacking_width_t required_minimum_width;
		if (string_len > max_compressed_string_length) {
			required_minimum_width = BitpackingPrimitives::MinimumBitWidth(string_len);
		} else {
			required_minimum_width = current_width;
		}

		size_t current_dict_size = current_dictionary.size;
		idx_t current_string_count = index_buffer.size();

		size_t dict_offsets_size =
		    BitpackingPrimitives::GetRequiredSize(current_string_count + 1, required_minimum_width);

		// TODO switch to a symbol table per RowGroup, saves a bit of space
		return sizeof(fsst_compression_header_t) + current_dict_size + dict_offsets_size + string_len +
		       fsst_serialized_symbol_table_size;
	}